

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O3

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  uint32_t uVar1;
  uint64_t localUsec;
  uint8_t pong_message [12];
  undefined1 local_1c;
  undefined8 local_1b;
  undefined2 local_13;
  undefined1 local_11;
  
  if (bytes == 9 && channel == 0x33) {
    local_1c = 0x4e;
    local_1b = *(undefined8 *)(data + 1);
    localUsec = tonk_time();
    uVar1 = tonk::SDKConnection::ToRemoteTime23(&this->super_SDKConnection,localUsec);
    local_11 = (undefined1)(uVar1 >> 0x10);
    local_13 = (undefined2)uVar1;
    tonk::SDKConnection::Send(&this->super_SDKConnection,&local_1c,0xc,0x33);
  }
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_Reliable1 && bytes == 9)
    {
        uint8_t pong_message[1 + 8 + 3];
        pong_message[0] = 78;
        for (int i = 0; i < 8; ++i) {
            pong_message[i + 1] = data[i + 1];
        }
        uint32_t remoteTS23 = ToRemoteTime23(tonk_time());
        tonk::WriteU24_LE(pong_message + 1 + 8, remoteTS23);
        Send(pong_message, 1 + 8 + 3, channel);
    }
}